

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

uint64 Clasp::StrRef::create(char *str,size_t len)

{
  __atomic_base<unsigned_int> *__s;
  size_t in_RSI;
  void *in_RDI;
  RefCount *p;
  char *mem;
  __atomic_base<unsigned_int> *this;
  
  __s = (__atomic_base<unsigned_int> *)malloc(in_RSI + 5);
  this = __s;
  memset(__s,0,4);
  memcpy(this + 1,in_RDI,in_RSI);
  *(undefined1 *)((long)&this[1]._M_i + in_RSI) = 0;
  std::__atomic_base<unsigned_int>::operator=(this,(__int_type)((ulong)__s >> 0x20));
  return (uint64)this;
}

Assistant:

static uint64      create(const char* str, std::size_t len) {
		char*   mem = (char*)malloc(sizeof(RefCount) + len + 1);
		RefCount* p = new (mem) RefCount();
		std::memcpy(mem + sizeof(RefCount), str, len);
		mem[sizeof(RefCount) + len] = 0;
		*p = 1;
		return static_cast<uint64>(reinterpret_cast<uintp>(mem));
	}